

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

ConstraintItemSyntax * __thiscall
slang::parsing::Parser::parseConstraintItem(Parser *this,bool allowBlock,bool isTopLevel)

{
  Token closeParen;
  bool bVar1;
  TokenKind TVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  ExpressionConstraintSyntax *pEVar5;
  ForeachLoopListSyntax *loopList;
  LoopConstraintSyntax *pLVar6;
  SourceLocation SVar7;
  undefined8 uVar8;
  ElseConstraintClauseSyntax *elseClause;
  ConditionalConstraintSyntax *pCVar9;
  RangeListSyntax *ranges;
  UniquenessConstraintSyntax *pUVar10;
  DisableConstraintSyntax *pDVar11;
  ConstraintBlockSyntax *pCVar12;
  ConstraintItemSyntax *pCVar13;
  ImplicationConstraintSyntax *pIVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SolveBeforeConstraintSyntax *pSVar15;
  undefined7 in_register_00000011;
  Info *pIVar16;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *extraout_RDX_03;
  EVP_PKEY_CTX *src;
  TokenKind TVar17;
  Token TVar18;
  Token TVar19;
  SourceRange range;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> _Var20;
  Token elseKeyword;
  Token disable;
  Token openParen;
  Token before;
  Token semi;
  Token solve;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> afterBuffer;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> beforeBuffer;
  Token local_220;
  ExpressionSyntax *local_210;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_208;
  ulong local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e0;
  Token local_1d0;
  Token local_1c0;
  undefined8 local_1b0;
  Info *local_1a8;
  ConstraintItemSyntax *local_1a0;
  Info *local_198;
  undefined8 local_190;
  undefined1 local_188 [16];
  SyntaxNode *local_178;
  SyntaxNode *pSStack_170;
  pointer local_160;
  undefined8 local_150;
  Info *pIStack_148;
  Token local_140;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_130;
  ulong local_120;
  undefined1 local_118 [96];
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_b8 [2];
  Token local_40;
  
  pCVar12 = (ConstraintBlockSyntax *)(CONCAT71(in_register_00000011,isTopLevel) & 0xffffffff);
  TVar18 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar18.kind;
  if (TVar2 < IfKeyword) {
    if (TVar2 == OpenBrace) {
      if (allowBlock) {
        local_b8[0].data_ = (pointer)CONCAT44(local_b8[0].data_._4_4_,1);
        TVar18 = ParserBase::peek(&this->super_ParserBase,1);
        if ((TVar18.kind == CloseBrace) ||
           (bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInConcatenationExpr>
                              (this,(uint32_t *)local_b8,OpenBrace,CloseBrace), !bVar1)) {
          bVar1 = false;
          pCVar12 = parseConstraintBlock(this,false);
        }
        else {
          bVar1 = true;
        }
        if (!bVar1) {
          return &pCVar12->super_ConstraintItemSyntax;
        }
      }
    }
    else {
      if (TVar2 == DisableKeyword) {
        TVar18 = ParserBase::consume(&this->super_ParserBase);
        disable.info = TVar18.info;
        local_210 = TVar18._0_8_;
        TVar18 = ParserBase::expect(&this->super_ParserBase,SoftKeyword);
        pEVar4 = parseExpression(this);
        local_140 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        disable._0_8_ = local_210;
        pDVar11 = slang::syntax::SyntaxFactory::disableConstraint
                            (&this->factory,disable,TVar18,pEVar4,local_140);
        return &pDVar11->super_ConstraintItemSyntax;
      }
      if (TVar2 == ForeachKeyword) {
        TVar18 = ParserBase::consume(&this->super_ParserBase);
        loopList = parseForeachLoopVariables(this);
        pCVar13 = parseConstraintItem(this,true,false);
        pLVar6 = slang::syntax::SyntaxFactory::loopConstraint
                           (&this->factory,TVar18,loopList,pCVar13);
        return &pLVar6->super_ConstraintItemSyntax;
      }
    }
LAB_001f9945:
    TVar18 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar18.kind);
    if (bVar1 || allowBlock) {
      TVar18 = ParserBase::peek(&this->super_ParserBase);
      pEVar4 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x84,0);
      if ((allowBlock) ||
         (TVar19 = ParserBase::peek(&this->super_ParserBase),
         TVar18.kind != TVar19.kind || TVar18.info != TVar19.info)) {
        bVar1 = ParserBase::peek(&this->super_ParserBase,MinusArrow);
        if (bVar1) {
          TVar18 = ParserBase::consume(&this->super_ParserBase);
          pCVar13 = parseConstraintItem(this,true,false);
          pIVar14 = slang::syntax::SyntaxFactory::implicationConstraint
                              (&this->factory,pEVar4,TVar18,pCVar13);
          return &pIVar14->super_ConstraintItemSyntax;
        }
        Token::Token(&local_40);
        TVar18 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        pEVar5 = slang::syntax::SyntaxFactory::expressionConstraint
                           (&this->factory,local_40,pEVar4,TVar18);
        return &pEVar5->super_ConstraintItemSyntax;
      }
    }
    return (ConstraintItemSyntax *)0x0;
  }
  if (TVar2 < SolveKeyword) {
    if (TVar2 == IfKeyword) {
      TVar18 = ParserBase::consume(&this->super_ParserBase);
      TVar19 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      pIVar16 = TVar19.info;
      uVar8 = TVar19._0_8_;
      local_210 = parseExpression(this);
      TVar19 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      local_198 = TVar19.info;
      local_190 = TVar19._0_8_;
      elseClause = (ElseConstraintClauseSyntax *)0x0;
      local_1a0 = parseConstraintItem(this,true,false);
      bVar1 = ParserBase::peek(&this->super_ParserBase,ElseKeyword);
      if (bVar1) {
        TVar19 = ParserBase::consume(&this->super_ParserBase);
        elseKeyword.info = TVar19.info;
        local_1b0 = TVar19._0_8_;
        local_1a8 = pIVar16;
        pCVar13 = parseConstraintItem(this,true,false);
        pIVar16 = local_1a8;
        elseKeyword.kind = (undefined2)local_1b0;
        elseKeyword._2_1_ = local_1b0._2_1_;
        elseKeyword.numFlags.raw = local_1b0._3_1_;
        elseKeyword.rawLen = local_1b0._4_4_;
        elseClause = slang::syntax::SyntaxFactory::elseConstraintClause
                               (&this->factory,elseKeyword,pCVar13);
      }
      local_150 = local_190;
      pIStack_148 = local_198;
      closeParen.info = local_198;
      closeParen.kind = (undefined2)local_190;
      closeParen._2_1_ = local_190._2_1_;
      closeParen.numFlags.raw = local_190._3_1_;
      closeParen.rawLen = local_190._4_4_;
      openParen.info = pIVar16;
      openParen.kind = (short)uVar8;
      openParen._2_1_ = (char)((ulong)uVar8 >> 0x10);
      openParen.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
      openParen.rawLen = (int)((ulong)uVar8 >> 0x20);
      pCVar9 = slang::syntax::SyntaxFactory::conditionalConstraint
                         (&this->factory,TVar18,openParen,local_210,closeParen,local_1a0,elseClause)
      ;
      return &pCVar9->super_ConstraintItemSyntax;
    }
    if (TVar2 == SoftKeyword) {
      TVar18 = ParserBase::consume(&this->super_ParserBase);
      pEVar4 = parseExpressionOrDist(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
      TVar19 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      pEVar5 = slang::syntax::SyntaxFactory::expressionConstraint
                         (&this->factory,TVar18,pEVar4,TVar19);
      return &pEVar5->super_ConstraintItemSyntax;
    }
    goto LAB_001f9945;
  }
  if (TVar2 == UniqueKeyword) {
    TVar18 = ParserBase::consume(&this->super_ParserBase);
    ranges = parseRangeList(this);
    TVar19 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pUVar10 = slang::syntax::SyntaxFactory::uniquenessConstraint
                        (&this->factory,TVar18,ranges,TVar19);
    return &pUVar10->super_ConstraintItemSyntax;
  }
  if (TVar2 != SolveKeyword) goto LAB_001f9945;
  local_1c0 = ParserBase::consume(&this->super_ParserBase);
  if ((char)pCVar12 == '\0') {
    range = Token::range(&local_1c0);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa20005,range);
  }
  Token::Token(&local_220);
  local_b8[0].data_ = (pointer)local_b8[0].firstElement;
  local_b8[0].len = 0;
  local_b8[0].cap = 4;
  local_208._M_first._M_storage =
       (_Uninitialized<slang::parsing::Token,_true>)ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(local_208._0_2_);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar7 = Token::location(&local_208._M_first._M_storage);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar7);
    }
    local_220 = ParserBase::expect(&this->super_ParserBase,BeforeKeyword);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma
                      (local_208._M_first._M_storage.kind);
    if (bVar1) {
      do {
        pEVar4 = parseExpression(this);
        local_130._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
        local_120 = CONCAT71(local_120._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_b8,(TokenOrSyntax *)&local_130._M_first);
        TVar18 = ParserBase::peek(&this->super_ParserBase);
        TVar17 = TVar18.kind;
        bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(TVar17);
        iVar3 = 3;
        if (TVar17 != EndOfFile && !bVar1) {
          if (TVar17 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isBeforeOrSemicolon>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_220 = ParserBase::expect(&this->super_ParserBase,BeforeKeyword);
                iVar3 = 1;
                goto LAB_001f9909;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_130._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_120 = local_120 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_b8,(TokenOrSyntax *)&local_130._M_first);
          _Var20._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::peek(&this->super_ParserBase);
          TVar17 = _Var20._0_2_;
          bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(TVar17);
          if (TVar17 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          }
          else if (((local_208._M_first._M_storage.kind != TVar17) ||
                   (local_208._M_first._M_storage.info != _Var20._8_8_)) ||
                  (bVar1 = ParserBase::
                           skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isBeforeOrSemicolon>
                                     (&this->super_ParserBase,(DiagCode)0x10001,true), bVar1)) {
            iVar3 = 0;
            local_208._M_first._M_storage = _Var20._M_first._M_storage;
          }
        }
LAB_001f9909:
      } while (iVar3 == 0);
      if (iVar3 == 3) {
        local_220 = ParserBase::expect(&this->super_ParserBase,BeforeKeyword);
      }
    }
    else {
      ParserBase::reportMissingList
                (&this->super_ParserBase,(Token)local_208._M_first._M_storage,BeforeKeyword,
                 &local_220,(DiagCode)0x10001);
    }
  }
  Token::Token(&local_1d0);
  local_130._M_first._M_storage.info = (Info *)0x0;
  local_130._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_118;
  local_120 = 4;
  local_188 = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(local_188._0_2_);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar7 = Token::location((Token *)local_188);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar7);
    }
    local_1d0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(local_188._0_2_);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,(Token)local_188,Semicolon,&local_1d0,(DiagCode)0x10001);
      pIVar16 = extraout_RDX_03;
      goto LAB_001f9c29;
    }
    do {
      pEVar4 = parseExpression(this);
      local_208._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
      local_1f8 = CONCAT71(local_1f8._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_130._M_first,
                 (TokenOrSyntax *)&local_208._M_first);
      TVar18 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar18.kind);
      iVar3 = 3;
      pIVar16 = extraout_RDX;
      if (TVar18.kind == Comma && !bVar1) {
        local_208._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1f8 = local_1f8 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_130._M_first,
                   (TokenOrSyntax *)&local_208._M_first);
        TVar18 = ParserBase::peek(&this->super_ParserBase);
        TVar17 = TVar18.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar17);
        if (TVar17 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          pIVar16 = extraout_RDX_01;
        }
        else {
          pIVar16 = extraout_RDX_00;
          if (((local_188._0_2_ != TVar17) || ((Info *)local_188._8_8_ != TVar18.info)) ||
             (bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                                (&this->super_ParserBase,(DiagCode)0x10001,true),
             pIVar16 = extraout_RDX_02, bVar1)) {
            iVar3 = 0;
            local_188 = (undefined1  [16])TVar18;
          }
        }
      }
    } while (iVar3 == 0);
    if (iVar3 != 3) goto LAB_001f9c29;
    local_1d0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  pIVar16 = local_1d0.info;
LAB_001f9c29:
  TVar19 = local_1c0;
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_b8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar16
                    );
  TVar18 = local_220;
  local_1e0 = CONCAT44(extraout_var,iVar3);
  local_208._8_4_ = 3;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_0062f2d0;
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_130._M_first,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_160 = (pointer)CONCAT44(extraout_var_00,iVar3);
  local_188._8_4_ = 3;
  local_178 = (SyntaxNode *)0x0;
  pSStack_170 = (SyntaxNode *)0x0;
  local_188._0_8_ = &PTR_getChild_0062f2d0;
  pSVar15 = slang::syntax::SyntaxFactory::solveBeforeConstraint
                      (&this->factory,TVar19,
                       (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&local_208._M_first,
                       TVar18,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)local_188,
                       local_1d0);
  if (local_130._M_rest != (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_118) {
    operator_delete((void *)local_130._M_rest);
  }
  if (local_b8[0].data_ == (pointer)local_b8[0].firstElement) {
    return &pSVar15->super_ConstraintItemSyntax;
  }
  operator_delete(local_b8[0].data_);
  return &pSVar15->super_ConstraintItemSyntax;
}

Assistant:

ConstraintItemSyntax* Parser::parseConstraintItem(bool allowBlock, bool isTopLevel) {
    switch (peek().kind) {
        case TokenKind::SolveKeyword: {
            auto solve = consume();
            if (!isTopLevel)
                addDiag(diag::SolveBeforeDisallowed, solve.range());

            Token before;
            SmallVector<TokenOrSyntax, 4> beforeBuffer;
            parseList<isPossibleExpressionOrComma, isBeforeOrSemicolon>(
                beforeBuffer, TokenKind::BeforeKeyword, TokenKind::Comma, before,
                RequireItems::True, diag::ExpectedExpression,
                [this] { return &parseExpression(); });

            Token semi;
            SmallVector<TokenOrSyntax, 4> afterBuffer;
            parseList<isPossibleExpressionOrComma, isSemicolon>(
                afterBuffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpression(); });

            return &factory.solveBeforeConstraint(solve, beforeBuffer.copy(alloc), before,
                                                  afterBuffer.copy(alloc), semi);
        }
        case TokenKind::DisableKeyword: {
            auto disable = consume();
            auto soft = expect(TokenKind::SoftKeyword);
            auto& name = parseExpression();
            return &factory.disableConstraint(disable, soft, name, expect(TokenKind::Semicolon));
        }
        case TokenKind::ForeachKeyword: {
            auto keyword = consume();
            auto& vars = parseForeachLoopVariables();
            return &factory.loopConstraint(keyword, vars, *parseConstraintItem(true, false));
        }
        case TokenKind::IfKeyword: {
            auto ifKeyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& condition = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& constraints = *parseConstraintItem(true, false);

            ElseConstraintClauseSyntax* elseClause = nullptr;
            if (peek(TokenKind::ElseKeyword)) {
                auto elseKeyword = consume();
                elseClause = &factory.elseConstraintClause(elseKeyword,
                                                           *parseConstraintItem(true, false));
            }
            return &factory.conditionalConstraint(ifKeyword, openParen, condition, closeParen,
                                                  constraints, elseClause);
        }
        case TokenKind::UniqueKeyword: {
            auto keyword = consume();
            auto& list = parseRangeList();
            return &factory.uniquenessConstraint(keyword, list, expect(TokenKind::Semicolon));
        }
        case TokenKind::SoftKeyword: {
            auto soft = consume();
            auto& exprOrDist = parseExpressionOrDist();
            return &factory.expressionConstraint(soft, exprOrDist, expect(TokenKind::Semicolon));
        }
        case TokenKind::OpenBrace: {
            // Ambiguity here: an open brace could either be the start of a constraint block
            // or the start of a concatenation expression. Descend into the expression until
            // we can find out for sure one way or the other.
            if (allowBlock) {
                uint32_t index = 1;
                if (peek(1).kind == TokenKind::CloseBrace ||
                    !scanTypePart<isNotInConcatenationExpr>(index, TokenKind::OpenBrace,
                                                            TokenKind::CloseBrace)) {
                    return &parseConstraintBlock(false);
                }
            }
            break;
        }
        default:
            break;
    }

    // If we reach this point we have some invalid syntax here. If we're in a nested
    // constraint block (identified by allowBlock == true) then we should make up
    // an item and return. This is accomplished by falling through to the parseSubExpression below.
    // Otherwise, this is the top level and we should return nullptr so that we skip over
    // the offending token.
    if (!isPossibleExpression(peek().kind) && !allowBlock)
        return nullptr;

    // at this point we either have an expression with optional distribution or
    // we have an implication constraint
    Token curr = peek();
    auto expr =
        &parseSubExpression(ExpressionOptions::ConstraintContext | ExpressionOptions::AllowDist, 0);
    if (!allowBlock && curr == peek())
        return nullptr;

    if (peek(TokenKind::MinusArrow)) {
        auto arrow = consume();
        return &factory.implicationConstraint(*expr, arrow, *parseConstraintItem(true, false));
    }

    return &factory.expressionConstraint(Token(), *expr, expect(TokenKind::Semicolon));
}